

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float16 float16_sqrt_mips64(float16 a,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  FloatParts part;
  FloatParts FVar11;
  
  part._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  part.frac = (ulong)(a & 0x3ff);
  FVar11 = sf_canonicalize(part,&float16_params,status);
  if (((undefined1  [16])FVar11 & (undefined1  [16])0xfc00000000) == (undefined1  [16])0x0) {
    uVar6 = FVar11._12_4_ & 3;
    if (uVar6 != 1) {
      if ((FVar11._8_8_ >> 0x28 & 1) == 0) {
        if (uVar6 == 2) {
          uVar5 = FVar11.frac >> (~(byte)FVar11.exp & 1);
          uVar7 = 0x3e;
          lVar8 = 0;
          lVar9 = 0;
          do {
            uVar7 = uVar7 - 1;
            uVar10 = 1L << ((byte)uVar7 & 0x3f);
            uVar1 = uVar10 + lVar9;
            uVar2 = 0;
            uVar3 = 0;
            if (uVar1 <= uVar5) {
              lVar9 = uVar1 + uVar10;
              uVar2 = uVar1;
              uVar3 = uVar10;
            }
            lVar8 = lVar8 + uVar3;
            uVar5 = (uVar5 - uVar2) * 2;
          } while (0x30 < uVar7);
          uVar7 = FVar11._8_8_ & 0xfffffe0300000000 | (ulong)(uint)(FVar11.exp >> 1);
          FVar11.exp = (int)uVar7;
          FVar11.cls = (char)(uVar7 >> 0x20);
          FVar11.sign = (_Bool)(char)(uVar7 >> 0x28);
          FVar11._14_2_ = (short)(uVar7 >> 0x30);
          FVar11.frac = (ulong)(uVar5 != 0) + lVar8 * 2;
        }
        else if (uVar6 != 3) {
          __assert_fail("a.cls == float_class_normal",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                        ,0xc5f,"FloatParts sqrt_float(FloatParts, float_status *, const FloatFmt *)"
                       );
        }
      }
      else {
        status->float_exception_flags = status->float_exception_flags | 1;
        uVar4 = 0x2000000000000000;
        if (status->snan_bit_is_one != '\0') {
          uVar4 = 0x1fffffffffffffff;
        }
        FVar11.exp = 0x7fffffff;
        FVar11.cls = float_class_qnan;
        FVar11.sign = false;
        FVar11._14_2_ = 0;
        FVar11.frac = uVar4;
      }
    }
  }
  else {
    FVar11 = return_nan(FVar11,status);
  }
  FVar11 = round_canonical(FVar11,status,&float16_params);
  return (ushort)FVar11.frac & 0x3ff | (ushort)((FVar11.exp & 0x1fU) << 10) |
         (ushort)(FVar11._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 QEMU_FLATTEN float16_sqrt(float16 a, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pr = sqrt_float(pa, status, &float16_params);
    return float16_round_pack_canonical(pr, status);
}